

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O0

adios2_error adios2_between_step_pairs(size_t *between_step_pairs,adios2_engine *engine)

{
  byte bVar1;
  ulong *in_RDI;
  string *in_stack_00000018;
  adios2_engine *in_stack_00000020;
  Engine *engineCpp;
  allocator local_39;
  string local_38 [40];
  ulong *local_10;
  
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"for adios2_engine, in call to adios2_between_step_pairs",&local_39);
  adios2::helper::CheckForNullptr<adios2_engine_const>(in_stack_00000020,in_stack_00000018);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar1 = adios2::core::Engine::BetweenStepPairs();
  *local_10 = (ulong)(bVar1 & 1);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_between_step_pairs(size_t *between_step_pairs, const adios2_engine *engine)
{
    try
    {
        adios2::helper::CheckForNullptr(engine,
                                        "for adios2_engine, in call to adios2_between_step_pairs");

        const adios2::core::Engine *engineCpp =
            reinterpret_cast<const adios2::core::Engine *>(engine);

        *between_step_pairs = engineCpp->BetweenStepPairs();
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_between_step_pairs"));
    }
}